

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

void debug_output_logger(GLenum source,GLenum type,GLuint id,GLenum severity,GLsizei length,
                        GLchar *message,GLvoid *userParam)

{
  char srcstr [32];
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 local_28;
  undefined8 auStack_20 [3];
  
  switch(source) {
  case 0x8246:
    local_28 = CONCAT17(local_28._7_1_,0x4c476e000000);
    local_28._0_4_ = 0x6e65704f;
    break;
  case 0x8247:
    local_28._0_1_ = 'W';
    local_28._1_1_ = 'i';
    local_28._2_1_ = 'n';
    local_28._3_1_ = 'd';
    local_28._4_1_ = 'o';
    local_28._5_1_ = 'w';
    local_28._6_1_ = 's';
    local_28._7_1_ = '\0';
    break;
  case 0x8248:
    local_28._0_1_ = 'S';
    local_28._1_1_ = 'h';
    local_28._2_1_ = 'a';
    local_28._3_1_ = 'd';
    local_28._4_1_ = 'e';
    local_28._5_1_ = 'r';
    local_28._6_1_ = ' ';
    local_28._7_1_ = 'C';
    auStack_20[0]._0_1_ = 'o';
    auStack_20[0]._1_1_ = 'm';
    auStack_20[0]._2_1_ = 'p';
    auStack_20[0]._3_1_ = 'i';
    auStack_20[0]._4_1_ = 'l';
    auStack_20[0]._5_1_ = 'e';
    auStack_20[0]._6_1_ = 'r';
    auStack_20[0]._7_1_ = '\0';
    break;
  case 0x8249:
    local_28._0_1_ = 'T';
    local_28._1_1_ = 'h';
    local_28._2_1_ = 'i';
    local_28._3_1_ = 'r';
    local_28._4_1_ = 'd';
    local_28._5_1_ = ' ';
    local_28._6_1_ = 'P';
    local_28._7_1_ = 'a';
    auStack_20[0]._0_4_ = 0x797472;
    break;
  case 0x824a:
    local_28._0_1_ = 'A';
    local_28._1_1_ = 'p';
    local_28._2_1_ = 'p';
    local_28._3_1_ = 'l';
    local_28._4_1_ = 'i';
    local_28._5_1_ = 'c';
    local_28._6_1_ = 'a';
    local_28._7_1_ = 't';
    auStack_20[0]._0_4_ = 0x6e6f69;
    break;
  case 0x824b:
    local_28 = CONCAT26(local_28._6_2_,0x7200000000);
    local_28._0_4_ = 0x6568744f;
    break;
  default:
    local_28._0_4_ = 0x3f3f3f;
  }
  switch(type) {
  case 0x824c:
    local_48 = CONCAT26(local_48._6_2_,0x7200000000);
    local_48._0_4_ = 0x6f727245;
    break;
  case 0x824d:
    local_48._0_1_ = 'D';
    local_48._1_1_ = 'e';
    local_48._2_1_ = 'p';
    local_48._3_1_ = 'r';
    local_48._4_1_ = 'e';
    local_48._5_1_ = 'c';
    local_48._6_1_ = 'a';
    local_48._7_1_ = 't';
    uStack_40 = 0x42206465;
    uStack_3c = 0x76616865;
    uStack_38 = 0x726f69;
    break;
  case 0x824e:
    local_48._0_1_ = 'U';
    local_48._1_1_ = 'n';
    local_48._2_1_ = 'd';
    local_48._3_1_ = 'e';
    local_48._4_1_ = 'f';
    local_48._5_1_ = 'i';
    local_48._6_1_ = 'n';
    local_48._7_1_ = 'e';
    uStack_40 = 0x65422064;
    uStack_3c = 0x69766168;
    uStack_38 = CONCAT13(uStack_38._3_1_,0x726f);
    break;
  case 0x824f:
    local_48._0_1_ = 'P';
    local_48._1_1_ = 'o';
    local_48._2_1_ = 'r';
    local_48._3_1_ = 't';
    local_48._4_1_ = 'a';
    local_48._5_1_ = 'b';
    local_48._6_1_ = 'i';
    local_48._7_1_ = 'l';
    uStack_40 = 0x797469;
    break;
  case 0x8250:
    local_48._0_1_ = 'P';
    local_48._1_1_ = 'e';
    local_48._2_1_ = 'r';
    local_48._3_1_ = 'f';
    local_48._4_1_ = 'o';
    local_48._5_1_ = 'r';
    local_48._6_1_ = 'm';
    local_48._7_1_ = 'a';
    uStack_40 = 0x65636e;
    break;
  case 0x8251:
    local_48._0_1_ = 'M';
    local_48._1_1_ = 'e';
    local_48._2_1_ = 's';
    local_48._3_1_ = 's';
    local_48._4_1_ = 'a';
    local_48._5_1_ = 'g';
    local_48._6_1_ = 'e';
    local_48._7_1_ = '\0';
    break;
  default:
    local_48._0_4_ = 0x3f3f3f;
  }
  if ((severity & 0xfffffffe) == 0x9146) {
    fprintf(_stdout,"djg_error: %s %s\n-- Begin -- GL_debug_output\n%s\n-- End -- GL_debug_output\n"
            ,&local_28,&local_48,message);
    fflush(_stdout);
  }
  return;
}

Assistant:

static void APIENTRY
debug_output_logger(
        GLenum source,
        GLenum type,
        GLuint id,
        GLenum severity,
        GLsizei length,
        const GLchar* message,
        const GLvoid* userParam
        ) {
    char srcstr[32], typestr[32];

    switch(source) {
    case GL_DEBUG_SOURCE_API: strcpy(srcstr, "OpenGL"); break;
    case GL_DEBUG_SOURCE_WINDOW_SYSTEM: strcpy(srcstr, "Windows"); break;
    case GL_DEBUG_SOURCE_SHADER_COMPILER: strcpy(srcstr, "Shader Compiler"); break;
    case GL_DEBUG_SOURCE_THIRD_PARTY: strcpy(srcstr, "Third Party"); break;
    case GL_DEBUG_SOURCE_APPLICATION: strcpy(srcstr, "Application"); break;
    case GL_DEBUG_SOURCE_OTHER: strcpy(srcstr, "Other"); break;
    default: strcpy(srcstr, "???"); break;
    };

    switch(type) {
    case GL_DEBUG_TYPE_ERROR: strcpy(typestr, "Error"); break;
    case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR: strcpy(typestr, "Deprecated Behavior"); break;
    case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR: strcpy(typestr, "Undefined Behavior"); break;
    case GL_DEBUG_TYPE_PORTABILITY: strcpy(typestr, "Portability"); break;
    case GL_DEBUG_TYPE_PERFORMANCE: strcpy(typestr, "Performance"); break;
    case GL_DEBUG_TYPE_OTHER: strcpy(typestr, "Message"); break;
    default: strcpy(typestr, "???"); break;
    }

    if(severity == GL_DEBUG_SEVERITY_HIGH || severity == GL_DEBUG_SEVERITY_MEDIUM) {
        LOG("djg_error: %s %s\n"                \
            "-- Begin -- GL_debug_output\n" \
            "%s\n"                              \
            "-- End -- GL_debug_output\n",
            srcstr, typestr, message);
    } else if(severity == GL_DEBUG_SEVERITY_MEDIUM) {
        LOG("djg_warn: %s %s\n"                 \
            "-- Begin -- GL_debug_output\n" \
            "%s\n"                              \
            "-- End -- GL_debug_output\n",
            srcstr, typestr, message);
    }
}